

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.hpp
# Opt level: O2

path * __thiscall boost::filesystem::path::assign<char*>(path *this,char *begin,char *end)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> seq;
  char *local_30;
  long local_28;
  char local_20 [16];
  
  (this->m_pathname)._M_string_length = 0;
  *(this->m_pathname)._M_dataplus._M_p = '\0';
  if (begin != end) {
    local_30 = local_20;
    std::__cxx11::string::_M_construct<char*>((string *)&local_30);
    path_traits::convert(local_30,local_30 + local_28,&this->m_pathname);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return this;
}

Assistant:

path& assign(InputIterator begin, InputIterator end)
    {
      m_pathname.clear();
      if (begin != end)
      {
        std::basic_string<typename std::iterator_traits<InputIterator>::value_type>
          seq(begin, end);
        path_traits::convert(seq.c_str(), seq.c_str()+seq.size(), m_pathname);
      }
      return *this;
    }